

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O2

SUNErrCode
SUNMemoryHelper_Alloc
          (SUNMemoryHelper helper,SUNMemory *memptr,size_t mem_size,SUNMemoryType mem_type,
          void *queue)

{
  SUNErrCode SVar1;
  
  SVar1 = (*helper->ops->alloc)(helper,memptr,mem_size,mem_type,queue);
  return SVar1;
}

Assistant:

SUNErrCode SUNMemoryHelper_Alloc(SUNMemoryHelper helper, SUNMemory* memptr,
                                 size_t mem_size, SUNMemoryType mem_type,
                                 void* queue)
{
  SUNErrCode ier = SUN_SUCCESS;
  SUNFunctionBegin(helper->sunctx);
  SUNAssert(helper->ops->alloc, SUN_ERR_NOT_IMPLEMENTED);
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(helper));
  ier = helper->ops->alloc(helper, memptr, mem_size, mem_type, queue);
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(helper));
  return ier;
}